

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * trimStars(string *__return_storage_ptr__,string *input)

{
  reference pvVar1;
  size_type sVar2;
  ulong local_28;
  size_t pos;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,input);
  for (local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(__return_storage_ptr__,'*',0); local_28 != 0xffffffffffffffff;
      local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(__return_storage_ptr__,'*',local_28 + 1)) {
    if (((local_28 == 0) ||
        (pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](__return_storage_ptr__,local_28 - 1), *pvVar1 == ' ')) ||
       (pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](__return_storage_ptr__,local_28 - 1), *pvVar1 == '*')) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(__return_storage_ptr__);
      if (((local_28 < sVar2 - 1) &&
          (pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator[](__return_storage_ptr__,local_28 + 1), *pvVar1 != ' ')) &&
         (pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](__return_storage_ptr__,local_28 + 1), *pvVar1 != '*')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (__return_storage_ptr__,local_28 + 1,1,' ');
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (__return_storage_ptr__,local_28,1,' ');
      local_28 = local_28 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string trimStars( std::string const & input )
{
  std::string result = input;
  size_t      pos    = result.find( '*' );
  while ( pos != std::string::npos )
  {
    if ( ( 0 < pos ) && ( result[pos - 1] != ' ' ) && ( result[pos - 1] != '*' ) )
    {
      result.insert( pos, 1, ' ' );
      ++pos;
    }
    else if ( ( pos < result.length() - 1 ) && ( result[pos + 1] != ' ' ) && ( result[pos + 1] != '*' ) )
    {
      result.insert( pos + 1, 1, ' ' );
    }
    pos = result.find( '*', pos + 1 );
  }
  return result;
}